

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O0

_Bool run_toplevel_callbacks(void)

{
  toplevel_callback_fn_t *pp_Var1;
  void **ppvVar2;
  _Bool local_9;
  _Bool done_something;
  
  local_9 = false;
  if (cbhead != (callback *)0x0) {
    cbcurr = cbhead;
    if (cbhead->next == (callback *)0x0) {
      cbtail = (callback *)0x0;
    }
    pp_Var1 = &cbhead->fn;
    ppvVar2 = &cbhead->ctx;
    cbhead = cbhead->next;
    (**pp_Var1)(*ppvVar2);
    safefree(cbcurr);
    cbcurr = (callback *)0x0;
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool run_toplevel_callbacks(void)
{
    bool done_something = false;

    if (cbhead) {
        /*
         * Transfer the head callback into cbcurr to indicate that
         * it's being executed. Then operations which transform the
         * queue, like delete_callbacks_for_context, can proceed as if
         * it's not there.
         */
        cbcurr = cbhead;
        cbhead = cbhead->next;
        if (!cbhead)
            cbtail = NULL;

        /*
         * Now run the callback, and then clear it out of cbcurr.
         */
        cbcurr->fn(cbcurr->ctx);
        sfree(cbcurr);
        cbcurr = NULL;

        done_something = true;
    }
    return done_something;
}